

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayIndexStaticEnumerator.h
# Opt level: O2

bool __thiscall
Js::ES5ArrayIndexStaticEnumerator<false>::MoveNext
          (ES5ArrayIndexStaticEnumerator<false> *this,PropertyAttributes *attributes)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  BOOL BVar5;
  uint uVar6;
  undefined4 *puVar7;
  uint index;
  uint key;
  byte bVar8;
  
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  key = this->m_index;
  index = this->m_dataIndex;
  uVar6 = this->m_descriptorIndex;
  do {
    if (index < uVar6) {
      uVar6 = index;
    }
    if (key != uVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Library/ES5ArrayIndexStaticEnumerator.h"
                                  ,0x3e,"(m_index == min(m_dataIndex, m_descriptorIndex))",
                                  "m_index == min(m_dataIndex, m_descriptorIndex)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
      key = this->m_index;
      index = this->m_dataIndex;
    }
    if (key == index) {
      uVar4 = JavascriptArray::GetNextIndex(&this->m_array->super_JavascriptArray,index);
      this->m_dataIndex = uVar4;
      key = this->m_index;
    }
    if (key == this->m_descriptorIndex) {
LAB_00d61feb:
      uVar6 = ES5Array::GetNextDescriptor
                        (this->m_array,key,&this->m_descriptor,&this->m_descriptorValidationToken);
      this->m_descriptorIndex = uVar6;
    }
    else {
      BVar5 = ES5Array::IsValidDescriptorToken(this->m_array,this->m_descriptorValidationToken);
      if (BVar5 == 0) {
        key = this->m_index;
        goto LAB_00d61feb;
      }
      uVar6 = this->m_descriptorIndex;
    }
    uVar1 = this->m_initialLength;
    index = this->m_dataIndex;
    key = uVar6;
    if (index < uVar6) {
      key = index;
    }
    this->m_index = key;
    if (uVar1 <= key) goto LAB_00d6203c;
    if (index < uVar6) {
      bVar8 = 1;
      goto LAB_00d6202e;
    }
    bVar8 = this->m_descriptor->Attributes;
    if ((bVar8 & 1) != 0) {
LAB_00d6202e:
      if (attributes != (PropertyAttributes *)0x0) {
        *attributes = bVar8;
      }
LAB_00d6203c:
      return key < uVar1;
    }
  } while( true );
}

Assistant:

bool MoveNext(PropertyAttributes* attributes = nullptr)
        {
            while (true)
            {
                Assert(m_index == min(m_dataIndex, m_descriptorIndex));
                if (m_index == m_dataIndex)
                {
                    m_dataIndex = m_array->GetNextIndex(m_dataIndex);
                }
                if (m_index == m_descriptorIndex || !m_array->IsValidDescriptorToken(m_descriptorValidationToken))
                {
                    m_descriptorIndex = m_array->GetNextDescriptor(m_index, &m_descriptor, &m_descriptorValidationToken);
                }

                m_index = min(m_dataIndex, m_descriptorIndex);
                if (m_index >= m_initialLength) // End of array
                {
                    break;
                }

                if (enumNonEnumerable
                    || m_index < m_descriptorIndex
                    || (m_descriptor->Attributes & PropertyEnumerable))
                {
                    if (attributes != nullptr)
                    {
                        if (m_index < m_descriptorIndex)
                        {
                            *attributes = PropertyEnumerable;
                        }
                        else
                        {
                            *attributes = m_descriptor->Attributes;
                        }
                    }

                    return true;
                }
            }

            return false;
        }